

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O0

void pad_tree_ushort(HuffmanTree *huffmanTree,unsigned_short *L,unsigned_short *R,uint *C,uchar *t,
                    uint i,node root)

{
  unsigned_short *in_RCX;
  unsigned_short *in_RDX;
  HuffmanTree *in_RSI;
  long in_RDI;
  uint *in_R8;
  uint in_R9D;
  node unaff_retaddr;
  node rroot;
  node lroot;
  node_t *pnVar1;
  undefined4 in_stack_ffffffffffffffd0;
  
  *(uint *)(in_RCX + (ulong)in_R9D * 2) = rroot->c;
  *(char *)((long)in_R8 + (ulong)in_R9D) = rroot->t;
  pnVar1 = rroot->left;
  if (pnVar1 != (node_t *)0x0) {
    *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
    *(short *)((long)&in_RSI->stateNum + (ulong)in_R9D * 2) = (short)*(undefined4 *)(in_RDI + 0x38);
    pad_tree_ushort(in_RSI,in_RDX,in_RCX,in_R8,(uchar *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                    (uint)((ulong)pnVar1 >> 0x20),unaff_retaddr);
  }
  if (rroot->right != (node_t *)0x0) {
    *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
    in_RDX[in_R9D] = (unsigned_short)*(undefined4 *)(in_RDI + 0x38);
    pad_tree_ushort(in_RSI,in_RDX,in_RCX,in_R8,(uchar *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                    (uint)((ulong)pnVar1 >> 0x20),unaff_retaddr);
  }
  return;
}

Assistant:

void pad_tree_ushort(HuffmanTree* huffmanTree, unsigned short* L, unsigned short* R, unsigned int* C, unsigned char* t, unsigned int i, node root)
{
	C[i] = root->c;
	t[i] = root->t;
	node lroot = root->left;
	if(lroot!=0)
	{
		huffmanTree->n_inode++;
		L[i] = huffmanTree->n_inode;
		pad_tree_ushort(huffmanTree,L,R,C,t,huffmanTree->n_inode, lroot);
	}
	node rroot = root->right;
	if(rroot!=0)
	{
		huffmanTree->n_inode++;
		R[i] = huffmanTree->n_inode;
		pad_tree_ushort(huffmanTree,L,R,C,t,huffmanTree->n_inode, rroot);
	}	
}